

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::anon_unknown_1::DescriptorPoolTypeResolver::ParseTypeUrl
          (Status *__return_storage_ptr__,DescriptorPoolTypeResolver *this,string *type_url,
          string *type_name)

{
  pointer pcVar1;
  StringPiece error_message;
  int iVar2;
  Status *this_00;
  AlphaNum *in_R9;
  bool bVar3;
  AlphaNum local_118;
  AlphaNum local_e8;
  string local_b8;
  char *local_98;
  size_t local_90;
  char local_88 [32];
  AlphaNum local_68;
  Status *local_38;
  
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::substr((ulong)&local_98,(ulong)type_url);
  pcVar1 = (this->url_prefix_)._M_dataplus._M_p;
  local_68.piece_data_ = local_68.digits;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (this->url_prefix_)._M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  bVar3 = true;
  if (local_90 == local_68.piece_size_) {
    if (local_90 == 0) {
      bVar3 = false;
    }
    else {
      iVar2 = bcmp(local_98,local_68.piece_data_,local_90);
      bVar3 = iVar2 != 0;
    }
  }
  if (local_68.piece_data_ != local_68.digits) {
    operator_delete(local_68.piece_data_);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (bVar3) {
    local_98 = "Invalid type URL, type URLs must be of the form \'";
    local_90 = 0x31;
    local_68.piece_data_ = (this->url_prefix_)._M_dataplus._M_p;
    local_68.piece_size_ = (this->url_prefix_)._M_string_length;
    local_118.piece_data_ = "/<typename>\', got: ";
    local_118.piece_size_ = 0x13;
    local_e8.piece_data_ = (type_url->_M_dataplus)._M_p;
    local_e8.piece_size_ = type_url->_M_string_length;
    StrCat_abi_cxx11_(&local_b8,(protobuf *)&local_98,&local_68,&local_118,&local_e8,in_R9);
    this_00 = local_38;
    error_message.length_ = local_b8._M_string_length;
    error_message.ptr_ = local_b8._M_dataplus._M_p;
    if ((long)local_b8._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_b8._M_string_length,"size_t to int conversion");
    }
    Status::Status(this_00,INVALID_ARGUMENT,error_message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_98,(ulong)type_url);
    std::__cxx11::string::operator=((string *)type_name,(string *)&local_98);
    if (local_98 != local_88) {
      operator_delete(local_98);
    }
    this_00 = local_38;
    Status::Status(local_38);
  }
  return this_00;
}

Assistant:

Status ParseTypeUrl(const string& type_url, std::string* type_name) {
    if (type_url.substr(0, url_prefix_.size() + 1) != url_prefix_ + "/") {
      return Status(
          util::error::INVALID_ARGUMENT,
          StrCat("Invalid type URL, type URLs must be of the form '",
                       url_prefix_, "/<typename>', got: ", type_url));
    }
    *type_name = type_url.substr(url_prefix_.size() + 1);
    return Status();
  }